

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

ch_context * ch_vm_newcontext(ch_program program)

{
  ch_context *in_RDI;
  uint8_t *in_stack_00000008;
  ch_context *context;
  
  in_RDI->pstart = in_stack_00000008;
  in_RDI->pend = in_stack_00000008 + program.data_size;
  in_RDI->pcurrent = program.start + (long)(in_stack_00000008 + (uint)program.total_size);
  in_RDI->data_size = (size_t)program.start;
  ch_stack_create();
  memset(&in_RDI->call_stack,0,0x1808);
  in_RDI->exit = RUNNING;
  in_RDI->open_upvalues = (ch_upvalue *)0x0;
  memset(&in_RDI->globals,0,0x10);
  memset(&in_RDI->strings,0,0x10);
  (in_RDI->program).start = in_stack_00000008;
  (in_RDI->program).data_size = (size_t)program.start;
  (in_RDI->program).total_size = program.data_size;
  *(size_t *)&(in_RDI->program).program_start_ptr = program.total_size;
  (in_RDI->program_return_value).type = PRIMITIVE_NULL;
  memset(&(in_RDI->program_return_value).field_1,0,8);
  ch_table_create(&in_RDI->globals);
  ch_table_create(&in_RDI->strings);
  return in_RDI;
}

Assistant:

ch_context ch_vm_newcontext(ch_program program) {
  ch_context context = {
      .pstart = program.start,
      .pend = program.start + program.total_size,
      // Seek after the data section
      .pcurrent = program.start + program.data_size + program.program_start_ptr,
      .data_size = program.data_size,
      .stack = ch_stack_create(),
      .call_stack =
          (ch_call_stack){
              .size = 0,
          },
      .exit = RUNNING,
      .program = program,
      .program_return_value = MAKE_NULL(),
      .open_upvalues=NULL
  };

  ch_table_create(&context.globals);
  ch_table_create(&context.strings);

  return context;
}